

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::CordOutputStream::Next(CordOutputStream *this,void **data,int *size)

{
  Cord *this_00;
  CordBuffer *this_01;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  Span<char> SVar8;
  anon_union_16_2_b9f6da03_for_Rep_1 local_58;
  Cord local_40;
  
  this_00 = &this->cord_;
  sVar1 = absl::lts_20250127::Cord::InlineRep::size(&this_00->contents_);
  this_01 = &this->buffer_;
  sVar2 = absl::lts_20250127::CordBuffer::length(this_01);
  uVar7 = sVar2 + sVar1;
  uVar6 = this->size_hint_;
  sVar1 = 0x80;
  if (0x80 < uVar7) {
    sVar1 = uVar7;
  }
  sVar2 = uVar6 - uVar7;
  if (uVar7 <= uVar6 && sVar2 != 0) {
    sVar1 = sVar2;
  }
  switch(this->state_) {
  case kFull:
    sVar3 = absl::lts_20250127::CordBuffer::length(this_01);
    if (sVar3 == 0) {
      __assert_fail("buffer_.length() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                    ,0x273,
                    "virtual bool google::protobuf::io::CordOutputStream::Next(void **, int *)");
    }
    local_58.long_rep.rep = (this_01->rep_).field_0.long_rep.rep;
    local_58.long_rep.padding = (this->buffer_).rep_.field_0.long_rep.padding;
    (this_01->rep_).field_0.short_rep.raw_size = '\x01';
    absl::lts_20250127::Cord::Append(this_00,(CordBuffer *)&local_58.long_rep);
    absl::lts_20250127::CordBuffer::~CordBuffer((CordBuffer *)&local_58.long_rep);
  case kEmpty:
    sVar3 = absl::lts_20250127::CordBuffer::length(this_01);
    if (sVar3 != 0) {
      __assert_fail("buffer_.length() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                    ,0x277,
                    "virtual bool google::protobuf::io::CordOutputStream::Next(void **, int *)");
    }
    absl::lts_20250127::CordBuffer::CreateWithDefaultLimit((CordBuffer *)&local_40,sVar1);
    break;
  case kPartial:
    sVar1 = absl::lts_20250127::CordBuffer::length(this_01);
    sVar3 = absl::lts_20250127::CordBuffer::capacity(this_01);
    if (sVar3 <= sVar1) {
      __assert_fail("buffer_.length() < buffer_.capacity()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                    ,0x270,
                    "virtual bool google::protobuf::io::CordOutputStream::Next(void **, int *)");
    }
    goto switchD_002937e9_default;
  case kSteal:
    sVar3 = absl::lts_20250127::CordBuffer::length(this_01);
    if (sVar3 != 0) {
      __assert_fail("buffer_.length() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                    ,0x26b,
                    "virtual bool google::protobuf::io::CordOutputStream::Next(void **, int *)");
    }
    absl::lts_20250127::Cord::GetAppendBuffer(&local_40,(size_t)this_00,sVar1);
    break;
  default:
    goto switchD_002937e9_default;
  }
  absl::lts_20250127::CordBuffer::operator=(this_01,(CordBuffer *)&local_40);
  absl::lts_20250127::CordBuffer::~CordBuffer((CordBuffer *)&local_40);
switchD_002937e9_default:
  SVar8 = absl::lts_20250127::CordBuffer::available(this_01);
  uVar4 = SVar8.len_;
  if (uVar4 == 0) {
    __assert_fail("!span.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                  ,0x27e,"virtual bool google::protobuf::io::CordOutputStream::Next(void **, int *)"
                 );
  }
  uVar5 = 0xffffffffffffffff;
  if (uVar7 < uVar6) {
    uVar5 = sVar2;
  }
  *data = SVar8.ptr_;
  uVar6 = uVar5;
  if (uVar4 < uVar5) {
    uVar6 = uVar4;
  }
  *size = (int)uVar6;
  absl::lts_20250127::CordBuffer::IncreaseLengthBy(this_01,uVar6);
  this->state_ = (uVar5 < uVar4) + kFull;
  return true;
}

Assistant:

bool CordOutputStream::Next(void** data, int* size) {
  // Use 128 bytes as a minimum buffer size if we don't have any application
  // provided size hints. This number is picked somewhat arbitrary as 'small
  // enough to avoid excessive waste on small data, and large enough to not
  // waste CPU and memory on tiny buffer overhead'.
  // It is worth noting that absent size hints, we pick 'current size' as
  // the default buffer size (capped at max flat size), which means we quickly
  // double the buffer size. This is in contrast to `Cord::Append()` functions
  // accepting strings which use a conservative 10% growth.
  static const size_t kMinBlockSize = 128;

  size_t desired_size, max_size;
  const size_t cord_size = cord_.size() + buffer_.length();
  if (size_hint_ > cord_size) {
    // Try to hit size_hint_ exactly so the caller doesn't receive a larger
    // buffer than indicated, requiring a non-zero call to BackUp() to undo
    // the buffer capacity we returned beyond the indicated size hint.
    desired_size = size_hint_ - cord_size;
    max_size = desired_size;
  } else {
    // We're past the size hint or don't have a size hint.  Try to allocate a
    // block as large as what we have so far, or at least kMinBlockSize bytes.
    // CordBuffer will truncate this to an appropriate size if it is too large.
    desired_size = std::max(cord_size, kMinBlockSize);
    max_size = std::numeric_limits<size_t>::max();
  }

  switch (state_) {
    case State::kSteal:
      // Steal last buffer from Cord if available.
      assert(buffer_.length() == 0);
      buffer_ = cord_.GetAppendBuffer(desired_size);
      break;
    case State::kPartial:
      // Use existing capacity in 'buffer_`
      assert(buffer_.length() < buffer_.capacity());
      break;
    case State::kFull:
      assert(buffer_.length() > 0);
      cord_.Append(std::move(buffer_));
      [[fallthrough]];
    case State::kEmpty:
      assert(buffer_.length() == 0);
      buffer_ = absl::CordBuffer::CreateWithDefaultLimit(desired_size);
      break;
  }

  // Get all available capacity from the buffer.
  absl::Span<char> span = buffer_.available();
  assert(!span.empty());
  *data = span.data();

  // Only hand out up to 'max_size', which is limited if there is a size hint
  // specified, and we have more available than the size hint.
  if (span.size() > max_size) {
    *size = static_cast<int>(max_size);
    buffer_.IncreaseLengthBy(max_size);
    state_ = State::kPartial;
  } else {
    *size = static_cast<int>(span.size());
    buffer_.IncreaseLengthBy(span.size());
    state_ = State::kFull;
  }

  return true;
}